

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkDefaultCompatibility
          (CompatibilityChecker *this,Reader *value,Reader *replacement)

{
  bool bVar1;
  bool bVar2;
  int8_t iVar3;
  int8_t iVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  Which WVar7;
  Which WVar8;
  int16_t iVar9;
  int16_t iVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  int32_t iVar13;
  int32_t iVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  int64_t iVar17;
  int64_t iVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  Fault local_a0;
  Fault f_13;
  Fault f_12;
  Fault f_11;
  Fault f_10;
  Fault f_9;
  Fault f_8;
  Fault f_7;
  Fault f_6;
  Fault f_5;
  Fault f_4;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  Fault local_28;
  Fault f;
  Reader *replacement_local;
  Reader *value_local;
  CompatibilityChecker *this_local;
  
  f.exception = (Exception *)replacement;
  WVar7 = capnp::schema::Value::Reader::which(value);
  WVar8 = capnp::schema::Value::Reader::which((Reader *)f.exception);
  if (WVar7 == WVar8) {
    WVar7 = capnp::schema::Value::Reader::which(value);
    switch(WVar7) {
    case VOID:
      capnp::schema::Value::Reader::getVoid(value);
      capnp::schema::Value::Reader::getVoid((Reader *)f.exception);
      bVar1 = Void::operator==((Void *)((long)&f_1.exception + 3));
      if (!bVar1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4ae,FAILED,"value.getVoid() == replacement.getVoid()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_2);
      }
      break;
    case BOOL:
      bVar1 = capnp::schema::Value::Reader::getBool(value);
      bVar2 = capnp::schema::Value::Reader::getBool((Reader *)f.exception);
      if (bVar1 != bVar2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4af,FAILED,"value.getBool() == replacement.getBool()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_3);
      }
      break;
    case INT8:
      iVar3 = capnp::schema::Value::Reader::getInt8(value);
      iVar4 = capnp::schema::Value::Reader::getInt8((Reader *)f.exception);
      if (iVar3 != iVar4) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b0,FAILED,"value.getInt8() == replacement.getInt8()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_4);
      }
      break;
    case INT16:
      iVar9 = capnp::schema::Value::Reader::getInt16(value);
      iVar10 = capnp::schema::Value::Reader::getInt16((Reader *)f.exception);
      if (iVar9 != iVar10) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b1,FAILED,"value.getInt16() == replacement.getInt16()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_5);
      }
      break;
    case INT32:
      iVar13 = capnp::schema::Value::Reader::getInt32(value);
      iVar14 = capnp::schema::Value::Reader::getInt32((Reader *)f.exception);
      if (iVar13 != iVar14) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b2,FAILED,"value.getInt32() == replacement.getInt32()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_6);
      }
      break;
    case INT64:
      iVar17 = capnp::schema::Value::Reader::getInt64(value);
      iVar18 = capnp::schema::Value::Reader::getInt64((Reader *)f.exception);
      if (iVar17 != iVar18) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b3,FAILED,"value.getInt64() == replacement.getInt64()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_7);
      }
      break;
    case UINT8:
      uVar5 = capnp::schema::Value::Reader::getUint8(value);
      uVar6 = capnp::schema::Value::Reader::getUint8((Reader *)f.exception);
      if (uVar5 != uVar6) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b4,FAILED,"value.getUint8() == replacement.getUint8()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_8);
      }
      break;
    case UINT16:
      uVar11 = capnp::schema::Value::Reader::getUint16(value);
      uVar12 = capnp::schema::Value::Reader::getUint16((Reader *)f.exception);
      if (uVar11 != uVar12) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_9,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b5,FAILED,"value.getUint16() == replacement.getUint16()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_9);
      }
      break;
    case UINT32:
      uVar15 = capnp::schema::Value::Reader::getUint32(value);
      uVar16 = capnp::schema::Value::Reader::getUint32((Reader *)f.exception);
      if (uVar15 != uVar16) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b6,FAILED,"value.getUint32() == replacement.getUint32()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_10);
      }
      break;
    case UINT64:
      uVar19 = capnp::schema::Value::Reader::getUint64(value);
      uVar20 = capnp::schema::Value::Reader::getUint64((Reader *)f.exception);
      if (uVar19 != uVar20) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_11,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b7,FAILED,"value.getUint64() == replacement.getUint64()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_11);
      }
      break;
    case FLOAT32:
      fVar21 = capnp::schema::Value::Reader::getFloat32(value);
      fVar22 = capnp::schema::Value::Reader::getFloat32((Reader *)f.exception);
      if ((fVar21 != fVar22) || (NAN(fVar21) || NAN(fVar22))) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_12,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b8,FAILED,"value.getFloat32() == replacement.getFloat32()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_12);
      }
      break;
    case FLOAT64:
      dVar23 = capnp::schema::Value::Reader::getFloat64(value);
      dVar24 = capnp::schema::Value::Reader::getFloat64((Reader *)f.exception);
      if ((dVar23 != dVar24) || (NAN(dVar23) || NAN(dVar24))) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&f_13,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b9,FAILED,"value.getFloat64() == replacement.getFloat64()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&f_13);
      }
      break;
    case TEXT:
    case DATA:
    case LIST:
    case STRUCT:
    case INTERFACE:
    case ANY_POINTER:
      break;
    case ENUM:
      uVar11 = capnp::schema::Value::Reader::getEnum(value);
      uVar12 = capnp::schema::Value::Reader::getEnum((Reader *)f.exception);
      if (uVar11 != uVar12) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4ba,FAILED,"value.getEnum() == replacement.getEnum()",
                   "\"default value changed\"",(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&local_a0);
      }
    }
  }
  else {
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4a4,FAILED,"value.which() == replacement.which()","");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&local_28);
  }
  return;
}

Assistant:

void checkDefaultCompatibility(const schema::Value::Reader& value,
                                 const schema::Value::Reader& replacement) {
    // Note that we test default compatibility only after testing type compatibility, and default
    // values have already been validated as matching their types, so this should pass.
    KJ_ASSERT(value.which() == replacement.which()) {
      compatibility = INCOMPATIBLE;
      return;
    }

    switch (value.which()) {
#define HANDLE_TYPE(discrim, name) \
      case schema::Value::discrim: \
        VALIDATE_SCHEMA(value.get##name() == replacement.get##name(), "default value changed"); \
        break;
      HANDLE_TYPE(VOID, Void);
      HANDLE_TYPE(BOOL, Bool);
      HANDLE_TYPE(INT8, Int8);
      HANDLE_TYPE(INT16, Int16);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT8, Uint8);
      HANDLE_TYPE(UINT16, Uint16);
      HANDLE_TYPE(UINT32, Uint32);
      HANDLE_TYPE(UINT64, Uint64);
      HANDLE_TYPE(FLOAT32, Float32);
      HANDLE_TYPE(FLOAT64, Float64);
      HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

      case schema::Value::TEXT:
      case schema::Value::DATA:
      case schema::Value::LIST:
      case schema::Value::STRUCT:
      case schema::Value::INTERFACE:
      case schema::Value::ANY_POINTER:
        // It's not a big deal if default values for pointers change, and it would be difficult for
        // us to compare these defaults here, so just let it slide.
        break;
    }
  }